

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

long duckdb::BinaryLambdaWrapper::
     Operation<duckdb::DamerauLevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
               (anon_class_8_1_6971b95b fun,string_t left,string_t right,ValidityMask *mask,
               idx_t idx)

{
  size_type __n;
  size_type __n_00;
  value_type vVar1;
  mapped_type_conflict mVar2;
  reference pvVar3;
  reference pvVar4;
  mapped_type_conflict *pmVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  size_type sVar9;
  ulong uVar10;
  size_type sVar11;
  value_type vVar12;
  key_type_conflict4 *__k;
  size_type sVar13;
  ulong uVar14;
  bool bVar15;
  vector<duckdb::vector<unsigned_long,_true>,_true> distance;
  idx_t inf;
  allocator_type local_102;
  allocator_type local_101;
  size_type local_100;
  long local_f8;
  long local_f0;
  mapped_type_conflict local_e8;
  vector<duckdb::vector<unsigned_long,_true>,_std::allocator<duckdb::vector<unsigned_long,_true>_>_>
  local_e0;
  long local_c8;
  char *local_c0;
  size_type local_b8;
  mapped_type_conflict local_b0;
  ulong local_a8;
  size_type local_a0;
  mapped_type_conflict local_98;
  mapped_type_conflict local_90;
  undefined8 local_88;
  long local_80;
  undefined8 local_78;
  long local_70;
  _Rb_tree<char,_std::pair<const_char,_unsigned_long>,_std::_Select1st<std::pair<const_char,_unsigned_long>_>,_std::less<char>,_std::allocator<std::pair<const_char,_unsigned_long>_>_>
  local_68;
  value_type_conflict local_38;
  
  local_80 = right.value._0_8_;
  local_88 = left.value._8_8_;
  local_70 = left.value._0_8_;
  uVar8 = left.value._8_4_;
  uVar10 = (ulong)uVar8;
  vVar12 = uVar10;
  if (((uint)fun.result != 0) && (vVar12 = (ulong)fun.result & 0xffffffff, uVar8 != 0)) {
    local_f8 = local_70;
    if ((uint)fun.result < 0xd) {
      local_f8 = (long)&local_78 + 4;
    }
    local_f0 = local_80;
    if (uVar8 < 0xd) {
      local_f0 = (long)&local_88 + 4;
    }
    local_38 = uVar10 + 1 + vVar12;
    local_78 = fun.result;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,uVar10 + 2,
               &local_38,&local_101);
    ::std::
    vector<duckdb::vector<unsigned_long,_true>,_std::allocator<duckdb::vector<unsigned_long,_true>_>_>
    ::vector(&local_e0,vVar12 + 2,(value_type *)&local_68,&local_102);
    if ((pointer)local_68._M_impl._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_68._M_impl._0_8_);
    }
    local_68._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)((long)&local_68 + 8);
    local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
    sVar13 = 0;
    local_68._M_impl.super__Rb_tree_header._M_header._M_right =
         local_68._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      __n = sVar13 + 1;
      pvVar3 = vector<duckdb::vector<unsigned_long,_true>,_true>::operator[]
                         ((vector<duckdb::vector<unsigned_long,_true>,_true> *)&local_e0,__n);
      pvVar4 = vector<unsigned_long,_true>::operator[](pvVar3,1);
      *pvVar4 = sVar13;
      sVar13 = __n;
    } while (vVar12 + 1 != __n);
    local_c8 = -uVar10;
    sVar11 = 1;
    do {
      pvVar3 = vector<duckdb::vector<unsigned_long,_true>,_true>::operator[]
                         ((vector<duckdb::vector<unsigned_long,_true>,_true> *)&local_e0,1);
      sVar9 = sVar11 + 1;
      pvVar4 = vector<unsigned_long,_true>::operator[](pvVar3,sVar9);
      *pvVar4 = sVar11;
      sVar11 = sVar9;
    } while (local_c8 + sVar9 != 1);
    local_e8 = 0;
    local_a8 = uVar10;
    local_a0 = vVar12 + 1;
    local_98 = vVar12;
    do {
      local_c0 = (char *)(local_f8 + local_e8);
      local_b8 = local_e8 + 2;
      local_100 = 0;
      sVar11 = 1;
      mVar2 = local_e8 + 1;
      local_90 = local_e8;
      do {
        local_e8 = mVar2;
        __k = (key_type_conflict4 *)(local_f0 + sVar11 + -1);
        pmVar5 = ::std::
                 map<char,_unsigned_long,_std::less<char>,_std::allocator<std::pair<const_char,_unsigned_long>_>_>
                 ::operator[]((map<char,_unsigned_long,_std::less<char>,_std::allocator<std::pair<const_char,_unsigned_long>_>_>
                               *)&local_68,__k);
        local_b0 = *pmVar5;
        bVar15 = *local_c0 != *__k;
        sVar9 = sVar11;
        if (bVar15) {
          sVar9 = local_100;
        }
        pvVar3 = vector<duckdb::vector<unsigned_long,_true>,_true>::operator[]
                           ((vector<duckdb::vector<unsigned_long,_true>,_true> *)&local_e0,local_e8)
        ;
        pvVar4 = vector<unsigned_long,_true>::operator[](pvVar3,sVar11);
        uVar10 = (ulong)bVar15 + *pvVar4;
        pvVar3 = vector<duckdb::vector<unsigned_long,_true>,_true>::operator[]
                           ((vector<duckdb::vector<unsigned_long,_true>,_true> *)&local_e0,local_b8)
        ;
        pvVar4 = vector<unsigned_long,_true>::operator[](pvVar3,sVar11);
        vVar12 = *pvVar4;
        pvVar3 = vector<duckdb::vector<unsigned_long,_true>,_true>::operator[]
                           ((vector<duckdb::vector<unsigned_long,_true>,_true> *)&local_e0,local_e8)
        ;
        __n_00 = sVar11 + 1;
        pvVar4 = vector<unsigned_long,_true>::operator[](pvVar3,__n_00);
        vVar1 = *pvVar4;
        pvVar3 = vector<duckdb::vector<unsigned_long,_true>,_true>::operator[]
                           ((vector<duckdb::vector<unsigned_long,_true>,_true> *)&local_e0,local_b0)
        ;
        pvVar4 = vector<unsigned_long,_true>::operator[](pvVar3,local_100);
        uVar6 = ((*pvVar4 - local_100) - local_b0) + local_90 + sVar11;
        uVar14 = vVar1 + 1;
        if (uVar6 <= vVar1 + 1) {
          uVar14 = uVar6;
        }
        uVar6 = vVar12 + 1;
        if (uVar14 <= vVar12 + 1) {
          uVar6 = uVar14;
        }
        if (uVar6 <= uVar10) {
          uVar10 = uVar6;
        }
        pvVar3 = vector<duckdb::vector<unsigned_long,_true>,_true>::operator[]
                           ((vector<duckdb::vector<unsigned_long,_true>,_true> *)&local_e0,local_b8)
        ;
        pvVar4 = vector<unsigned_long,_true>::operator[](pvVar3,__n_00);
        *pvVar4 = uVar10;
        lVar7 = local_c8 + sVar11;
        sVar11 = __n_00;
        local_100 = sVar9;
        mVar2 = local_e8;
      } while (lVar7 != 0);
      pmVar5 = ::std::
               map<char,_unsigned_long,_std::less<char>,_std::allocator<std::pair<const_char,_unsigned_long>_>_>
               ::operator[]((map<char,_unsigned_long,_std::less<char>,_std::allocator<std::pair<const_char,_unsigned_long>_>_>
                             *)&local_68,local_c0);
      *pmVar5 = local_e8;
    } while (local_e8 != local_98);
    pvVar3 = vector<duckdb::vector<unsigned_long,_true>,_true>::operator[]
                       ((vector<duckdb::vector<unsigned_long,_true>,_true> *)&local_e0,local_a0);
    pvVar4 = vector<unsigned_long,_true>::operator[](pvVar3,local_a8 + 1);
    vVar12 = *pvVar4;
    ::std::
    _Rb_tree<char,_std::pair<const_char,_unsigned_long>,_std::_Select1st<std::pair<const_char,_unsigned_long>_>,_std::less<char>,_std::allocator<std::pair<const_char,_unsigned_long>_>_>
    ::~_Rb_tree(&local_68);
    ::std::
    vector<duckdb::vector<unsigned_long,_true>,_std::allocator<duckdb::vector<unsigned_long,_true>_>_>
    ::~vector(&local_e0);
  }
  return vVar12;
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		return fun(left, right);
	}